

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QRectF * __thiscall
QGraphicsItem::mapRectFromParent(QRectF *__return_storage_ptr__,QGraphicsItem *this,QRectF *rect)

{
  QGraphicsItemPrivate *this_00;
  long in_FS_OFFSET;
  QTransform QStack_c8;
  QPointF local_78 [5];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  if (this_00->transformData == (TransformData *)0x0) {
    local_78[0].xp._0_4_ = *(undefined4 *)&(this_00->pos).xp;
    local_78[0].yp._0_4_ = *(undefined4 *)&(this_00->pos).yp;
    local_78[0].xp._4_4_ = *(uint *)((long)&(this_00->pos).xp + 4) ^ 0x80000000;
    local_78[0].yp._4_4_ = *(uint *)((long)&(this_00->pos).yp + 4) ^ 0x80000000;
    QRectF::translated(rect,local_78);
  }
  else {
    QGraphicsItemPrivate::transformToParent(&QStack_c8,this_00);
    QTransform::inverted((bool *)local_78);
    QTransform::mapRect((QRectF *)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsItem::mapRectFromParent(const QRectF &rect) const
{
    // COMBINE
    if (!d_ptr->transformData)
        return rect.translated(-d_ptr->pos);
    return d_ptr->transformToParent().inverted().mapRect(rect);
}